

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3VdbeTransferError(Vdbe *p)

{
  int iVar1;
  sqlite3 *db;
  Mem *p_00;
  sqlite3_value *pMem;
  
  db = p->db;
  iVar1 = p->rc;
  if (p->zErrMsg == (char *)0x0) {
    p_00 = db->pErr;
    if (p_00 != (Mem *)0x0) {
      if ((p_00->flags & 0x2400) == 0) {
        p_00->flags = 1;
      }
      else {
        vdbeMemClearExternAndSetNull(p_00);
      }
    }
    goto LAB_0014a421;
  }
  db->bBenignMalloc = db->bBenignMalloc + '\x01';
  if (sqlite3Hooks_0 != (code *)0x0) {
    (*sqlite3Hooks_0)();
  }
  pMem = db->pErr;
  if (pMem == (sqlite3_value *)0x0) {
    pMem = (sqlite3_value *)sqlite3DbMallocZero(db,0x38);
    if (pMem != (sqlite3_value *)0x0) {
      pMem->flags = 1;
      pMem->db = db;
      db->pErr = pMem;
      goto LAB_0014a3f3;
    }
    db->pErr = (sqlite3_value *)0x0;
  }
  else {
LAB_0014a3f3:
    sqlite3VdbeMemSetStr(pMem,p->zErrMsg,-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
  }
  if (sqlite3Hooks_1 != (code *)0x0) {
    (*sqlite3Hooks_1)();
  }
  db->bBenignMalloc = db->bBenignMalloc + 0xff;
LAB_0014a421:
  db->errCode = iVar1;
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeTransferError(Vdbe *p){
  sqlite3 *db = p->db;
  int rc = p->rc;
  if( p->zErrMsg ){
    db->bBenignMalloc++;
    sqlite3BeginBenignMalloc();
    if( db->pErr==0 ) db->pErr = sqlite3ValueNew(db);
    sqlite3ValueSetStr(db->pErr, -1, p->zErrMsg, SQLITE_UTF8, SQLITE_TRANSIENT);
    sqlite3EndBenignMalloc();
    db->bBenignMalloc--;
  }else if( db->pErr ){
    sqlite3ValueSetNull(db->pErr);
  }
  db->errCode = rc;
  return rc;
}